

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.h
# Opt level: O0

void __thiscall
xtest::AssertFail::AssertFail(AssertFail *this,char *case_name,char *msg,char *file_path,uint line)

{
  ostream *poVar1;
  char *pcVar2;
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [380];
  uint local_2c;
  char *pcStack_28;
  uint line_local;
  char *file_path_local;
  char *msg_local;
  char *case_name_local;
  AssertFail *this_local;
  
  local_2c = line;
  pcStack_28 = file_path;
  file_path_local = msg;
  msg_local = case_name;
  case_name_local = (char *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__AssertFail_00111d48;
  std::__cxx11::string::string((string *)&this->m_message);
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"[ASSERT]");
  poVar1 = std::operator<<(poVar1,'\"');
  pcVar2 = getFileName(this,pcStack_28);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\" line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2c);
  poVar1 = std::operator<<(poVar1," in \"");
  poVar1 = std::operator<<(poVar1,msg_local);
  poVar1 = std::operator<<(poVar1,"\": ");
  std::operator<<(poVar1,file_path_local);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_message,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

AssertFail(const char *case_name,const char *msg,const char *file_path,unsigned int line){
            std::stringstream ss;
            ss << "[ASSERT]"
               << '\"'
               #if XTEST_OUTPUT_FULL_PATH
               << file_path
               #else
               << getFileName(file_path)
               #endif
               << "\" line "
               << line
               << " in \""
               << case_name
               << "\": "
               << msg;
            m_message = ss.str();
        }